

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

int lj_err_unwind_dwarf(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                       _Unwind_Context *ctx)

{
  lua_State *L_00;
  TValue *pTVar1;
  void *pvVar2;
  GCstr *pGVar3;
  code *pcVar4;
  uint local_ac;
  int errcode;
  lua_State *L;
  void *cf;
  _Unwind_Context *ctx_local;
  _Unwind_Exception *uex_local;
  uint64_t uexclass_local;
  int actions_local;
  int version_local;
  
  if (version == 1) {
    pvVar2 = (void *)_Unwind_GetCFA(ctx);
    L_00 = *(lua_State **)((long)pvVar2 + 0x10);
    if ((actions & 1U) == 0) {
      if ((actions & 2U) != 0) {
        if ((uexclass ^ 0x4c55414a49543200) < 0x100) {
          local_ac = (uint)uexclass & 0xff;
        }
        else {
          if ((actions & 4U) != 0) {
            _Unwind_DeleteException(uex);
          }
          local_ac = 2;
        }
        pvVar2 = err_unwind(L_00,pvVar2,local_ac);
        if ((actions & 8U) != 0) {
          return 8;
        }
        if (pvVar2 != (void *)0x0) {
          _Unwind_SetGR(ctx,0,local_ac);
          pcVar4 = lj_vm_unwind_c_eh;
          if (((ulong)pvVar2 & 2) != 0) {
            pcVar4 = lj_vm_unwind_ff_eh;
          }
          _Unwind_SetIP(ctx,pcVar4);
          return 7;
        }
        if ((actions & 4U) != 0) {
          _Unwind_SetGR(ctx,0,local_ac);
          _Unwind_SetIP(ctx,lj_vm_unwind_rethrow);
          return 7;
        }
      }
      actions_local = 8;
    }
    else {
      pvVar2 = err_unwind(L_00,pvVar2,0);
      if (pvVar2 == (void *)0x0) {
        actions_local = 8;
      }
      else {
        if (0xff < (uexclass ^ 0x4c55414a49543200)) {
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pGVar3 = lj_err_str(L_00,LJ_ERR_ERRCPP);
          pTVar1->u64 = (ulong)pGVar3 | 0xfffd800000000000;
        }
        actions_local = 6;
      }
    }
  }
  else {
    actions_local = 3;
  }
  return actions_local;
}

Assistant:

LJ_FUNCA int lj_err_unwind_dwarf(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  void *cf;
  lua_State *L;
  if (version != 1)
    return _URC_FATAL_PHASE1_ERROR;
  cf = (void *)_Unwind_GetCFA(ctx);
#ifdef LJ_TARGET_S390X
  cf -= 160; /* CFA points 160 bytes above r15. */
#endif
  L = cframe_L(cf);
  if ((actions & _UA_SEARCH_PHASE)) {
#if LJ_UNWIND_EXT
    if (err_unwind(L, cf, 0) == NULL)
      return _URC_CONTINUE_UNWIND;
#endif
    if (!LJ_UEXCLASS_CHECK(uexclass)) {
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRCPP));
    }
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    int errcode;
    if (LJ_UEXCLASS_CHECK(uexclass)) {
      errcode = LJ_UEXCLASS_ERRCODE(uexclass);
    } else {
      if ((actions & _UA_HANDLER_FRAME))
	_Unwind_DeleteException(uex);
      errcode = LUA_ERRRUN;
    }
#if LJ_UNWIND_EXT
    cf = err_unwind(L, cf, errcode);
    if ((actions & _UA_FORCE_UNWIND)) {
      return _URC_CONTINUE_UNWIND;
    } else if (cf) {
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)(cframe_unwind_ff(cf) ?
				     lj_vm_unwind_ff_eh :
				     lj_vm_unwind_c_eh));
      return _URC_INSTALL_CONTEXT;
    }
#if LJ_TARGET_X86ORX64
    else if ((actions & _UA_HANDLER_FRAME)) {
      /* Workaround for ancient libgcc bug. Still present in RHEL 5.5. :-/
      ** Real fix: http://gcc.gnu.org/viewcvs/trunk/gcc/unwind-dw2.c?r1=121165&r2=124837&pathrev=153877&diff_format=h
      */
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)lj_vm_unwind_rethrow);
      return _URC_INSTALL_CONTEXT;
    }
#endif
#else
    /* This is not the proper way to escape from the unwinder. We get away with
    ** it on non-x64 because the interpreter restores all callee-saved regs.
    */
    lj_err_throw(L, errcode);
#if LJ_TARGET_X64
#error "Broken build system -- only use the provided Makefiles!"
#endif
#endif
  }
  return _URC_CONTINUE_UNWIND;
}